

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O2

trie_node trie_node_get(trie t,vector keys)

{
  ulong uVar1;
  size_t sVar2;
  undefined8 *puVar3;
  set_value pvVar4;
  trie_node ptVar5;
  ulong position;
  bool bVar6;
  
  sVar2 = vector_size(keys);
  ptVar5 = t->root;
  position = 0;
  while( true ) {
    if (ptVar5 == (trie_node)0x0) {
      return (trie_node)0x0;
    }
    if (sVar2 <= position) break;
    puVar3 = (undefined8 *)vector_at(keys,position);
    if ((ptVar5->childs == (set)0x0) ||
       (pvVar4 = set_get(ptVar5->childs,(set_key)*puVar3), pvVar4 == (set_value)0x0)) {
      ptVar5 = (trie_node)0x0;
    }
    else {
      ptVar5 = t->node_list + *(long *)((long)pvVar4 + 8);
    }
    uVar1 = position + 1;
    bVar6 = sVar2 - 1 == position;
    position = uVar1;
    if ((bVar6) && (ptVar5 != (trie_node)0x0)) {
      return ptVar5;
    }
  }
  return (trie_node)0x0;
}

Assistant:

trie_node trie_node_get(trie t, vector keys)
{
	if (t != NULL)
	{
		size_t iterator, size = vector_size(keys);

		trie_node current_node = t->root;

		for (iterator = 0; current_node != NULL && iterator < size; ++iterator)
		{
			trie_key *key_ptr = vector_at(keys, iterator);

			trie_node next_node = NULL;

			if (current_node->childs != NULL)
			{
				trie_node_ref node_ref = set_get(current_node->childs, *key_ptr);

				if (node_ref != NULL)
				{
					next_node = &t->node_list[node_ref->index];
				}
			}

			if (iterator == (size - 1) && next_node != NULL)
			{
				return next_node;
			}

			current_node = next_node;
		}
	}

	return NULL;
}